

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VoxWriter.cpp
# Opt level: O0

VoxWriter * __thiscall vox::VoxWriter::GetErrnoMsg_abi_cxx11_(VoxWriter *this,int32_t *vError)

{
  int32_t *vError_local;
  string *res;
  
  std::__cxx11::string::string((string *)this);
  switch(*vError) {
  case 1:
    std::__cxx11::string::operator=((string *)this,"Operation not permitted");
    break;
  case 2:
    std::__cxx11::string::operator=((string *)this,"No such file or directory");
    break;
  case 3:
    std::__cxx11::string::operator=((string *)this,"No such process");
    break;
  case 4:
    std::__cxx11::string::operator=((string *)this,"Interrupted function");
    break;
  case 5:
    std::__cxx11::string::operator=((string *)this,"I / O error");
    break;
  case 6:
    std::__cxx11::string::operator=((string *)this,"No such device or address");
    break;
  case 7:
    std::__cxx11::string::operator=((string *)this,"Argument list too long");
    break;
  case 8:
    std::__cxx11::string::operator=((string *)this,"Exec format error");
    break;
  case 9:
    std::__cxx11::string::operator=((string *)this,"Bad file number");
    break;
  case 10:
    std::__cxx11::string::operator=((string *)this,"No spawned processes");
    break;
  case 0xb:
    std::__cxx11::string::operator=
              ((string *)this,
               "No more processes or not enough memory or maximum nesting level reached");
    break;
  case 0xc:
    std::__cxx11::string::operator=((string *)this,"Not enough memory");
    break;
  case 0xd:
    std::__cxx11::string::operator=((string *)this,"Permission denied");
    break;
  case 0xe:
    std::__cxx11::string::operator=((string *)this,"Bad address");
    break;
  case 0x10:
    std::__cxx11::string::operator=((string *)this,"Device or resource busy");
    break;
  case 0x11:
    std::__cxx11::string::operator=((string *)this,"File exists");
    break;
  case 0x12:
    std::__cxx11::string::operator=((string *)this,"Cross - device link");
    break;
  case 0x13:
    std::__cxx11::string::operator=((string *)this,"No such device");
    break;
  case 0x14:
    std::__cxx11::string::operator=((string *)this,"Not a director");
    break;
  case 0x15:
    std::__cxx11::string::operator=((string *)this,"Is a directory");
    break;
  case 0x16:
    std::__cxx11::string::operator=((string *)this,"Invalid argument");
    break;
  case 0x17:
    std::__cxx11::string::operator=((string *)this,"Too many files open in system");
    break;
  case 0x18:
    std::__cxx11::string::operator=((string *)this,"Too many open files");
    break;
  case 0x19:
    std::__cxx11::string::operator=((string *)this,"Inappropriate I / O control operation");
    break;
  case 0x1b:
    std::__cxx11::string::operator=((string *)this,"File too large");
    break;
  case 0x1c:
    std::__cxx11::string::operator=((string *)this,"No space left on device");
    break;
  case 0x1d:
    std::__cxx11::string::operator=((string *)this,"Invalid seek");
    break;
  case 0x1e:
    std::__cxx11::string::operator=((string *)this,"Read - only file system");
    break;
  case 0x1f:
    std::__cxx11::string::operator=((string *)this,"Too many links");
    break;
  case 0x20:
    std::__cxx11::string::operator=((string *)this,"Broken pipe");
    break;
  case 0x21:
    std::__cxx11::string::operator=((string *)this,"Math argument");
    break;
  case 0x22:
    std::__cxx11::string::operator=((string *)this,"Result too large");
    break;
  case 0x24:
    std::__cxx11::string::operator=((string *)this,"Resource deadlock would occur");
    break;
  case 0x26:
    std::__cxx11::string::operator=((string *)this,"Filename too long");
    break;
  case 0x27:
    std::__cxx11::string::operator=((string *)this,"No locks available");
    break;
  case 0x28:
    std::__cxx11::string::operator=((string *)this,"Function not supported");
    break;
  case 0x29:
    std::__cxx11::string::operator=((string *)this,"Directory not empty");
    break;
  case 0x2a:
    std::__cxx11::string::operator=((string *)this,"Illegal byte sequence");
    break;
  case 0x50:
    std::__cxx11::string::operator=((string *)this,"String was truncated");
  }
  return this;
}

Assistant:

std::string VoxWriter::GetErrnoMsg(const int32_t& vError) {
    std::string res;

    switch (vError) {
        case 1: res = "Operation not permitted"; break;
        case 2: res = "No such file or directory"; break;
        case 3: res = "No such process"; break;
        case 4: res = "Interrupted function"; break;
        case 5: res = "I / O error"; break;
        case 6: res = "No such device or address"; break;
        case 7: res = "Argument list too long"; break;
        case 8: res = "Exec format error"; break;
        case 9: res = "Bad file number"; break;
        case 10: res = "No spawned processes"; break;
        case 11: res = "No more processes or not enough memory or maximum nesting level reached"; break;
        case 12: res = "Not enough memory"; break;
        case 13: res = "Permission denied"; break;
        case 14: res = "Bad address"; break;
        case 16: res = "Device or resource busy"; break;
        case 17: res = "File exists"; break;
        case 18: res = "Cross - device link"; break;
        case 19: res = "No such device"; break;
        case 20: res = "Not a director"; break;
        case 21: res = "Is a directory"; break;
        case 22: res = "Invalid argument"; break;
        case 23: res = "Too many files open in system"; break;
        case 24: res = "Too many open files"; break;
        case 25: res = "Inappropriate I / O control operation"; break;
        case 27: res = "File too large"; break;
        case 28: res = "No space left on device"; break;
        case 29: res = "Invalid seek"; break;
        case 30: res = "Read - only file system"; break;
        case 31: res = "Too many links"; break;
        case 32: res = "Broken pipe"; break;
        case 33: res = "Math argument"; break;
        case 34: res = "Result too large"; break;
        case 36: res = "Resource deadlock would occur"; break;
        case 38: res = "Filename too long"; break;
        case 39: res = "No locks available"; break;
        case 40: res = "Function not supported"; break;
        case 41: res = "Directory not empty"; break;
        case 42: res = "Illegal byte sequence"; break;
        case 80: res = "String was truncated"; break;
    }

    return res;
}